

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfdcapi_elements_transaction_CfdGetDefaultBlindingKey_Test::TestBody
          (cfdcapi_elements_transaction_CfdGetDefaultBlindingKey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  int ret;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  void *handle;
  AssertHelper local_60;
  AssertHelper local_58;
  int local_4c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_38;
  void *local_18;
  
  local_18 = (void *)0x0;
  local_4c = CfdCreateHandle(&local_18);
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_48.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_38,"kCfdSuccess","ret",(CfdErrorCode *)&local_48,&local_4c);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x740,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_._0_1_ = local_18 != (void *)0x0;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_18 == (void *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_48,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x741,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                       (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p),
                      local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
      local_60.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_4c == 0) {
    local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_4c = CfdGetDefaultBlindingKey
                         (local_18,
                          "881a1ab07e99ab0626b4d93b3dddfd16cbc04342ee71aab4da7093e7b853fd80",
                          "001478bf37fbe762374026b2b884f7eb47fa61e3420d",(char **)&local_48);
    local_60.data_ = local_60.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_38,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&local_4c);
    if ((char)local_38._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_60);
      if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_38._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x74c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
        local_60.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_4c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_38,
                 "\"95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742\"",
                 "blinding_key","95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742",
                 (char *)local_48.ptr_);
      if ((char)local_38._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_60);
        if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_38._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x750,pcVar2);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_60.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_60.data_ + 8))();
          }
          local_60.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_38._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_48.ptr_);
    }
  }
  local_4c = CfdGetLastErrorCode(local_18);
  if (local_4c != 0) {
    local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_4c = CfdGetLastErrorMessage(local_18,(char **)&local_48);
    local_60.data_ = local_60.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_38,"kCfdSuccess","ret",(CfdErrorCode *)&local_60,&local_4c);
    if ((char)local_38._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_60);
      if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_38._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x759,pcVar2);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
        local_60.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_38,"\"\"","str_buffer","",(char *)local_48.ptr_);
    if ((char)local_38._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_60);
      if ((undefined8 *)local_38._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_38._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x75a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
        local_60.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_38._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_48.ptr_);
  }
  local_4c = CfdFreeHandle(local_18);
  local_48.ptr_ = local_48.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_38,"kCfdSuccess","ret",(CfdErrorCode *)&local_48,&local_4c);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x760,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CfdGetDefaultBlindingKey) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  if (ret == kCfdSuccess) {
    const char* master_blinding_key =
        "881a1ab07e99ab0626b4d93b3dddfd16cbc04342ee71aab4da7093e7b853fd80";
    // ert1q0zln07l8vgm5qf4jhzz00668lfs7xssdlxlysh
    const char* locking_script = "001478bf37fbe762374026b2b884f7eb47fa61e3420d";

    char* blinding_key = nullptr;
    ret = CfdGetDefaultBlindingKey(
        handle, master_blinding_key, locking_script, &blinding_key);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
          "95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742",
          blinding_key);
      CfdFreeStringBuffer(blinding_key);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}